

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

char * CleanseString(char *str)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(str,0x1c);
  if (pcVar1 == (char *)0x0) {
    return str;
  }
  if (pcVar1[1] != '\0') {
    if (pcVar1[1] != '[') {
      return str;
    }
    pcVar2 = strchr(pcVar1 + 2,0x5d);
    if (pcVar2 != (char *)0x0) {
      return str;
    }
  }
  *pcVar1 = '\0';
  return str;
}

Assistant:

char *CleanseString(char *str)
{
	char *escape = strrchr(str, TEXTCOLOR_ESCAPE);
	if (escape != NULL)
	{
		if (escape[1] == '\0')
		{
			*escape = '\0';
		}
		else if (escape[1] == '[')
		{
			char *close = strchr(escape + 2, ']');
			if (close == NULL)
			{
				*escape = '\0';
			}
		}
	}
	return str;
}